

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O2

void __thiscall IPAsirMiniSAT::add(IPAsirMiniSAT *this,int lit)

{
  Lit local_1c;
  
  reset(this);
  this->nomodel = true;
  if (lit == 0) {
    Minisat::SimpSolver::addClause(&this->super_SimpSolver,&this->clause);
    if ((this->clause).data != (Lit *)0x0) {
      (this->clause).sz = 0;
    }
  }
  else {
    local_1c = import(this,lit);
    Minisat::vec<Minisat::Lit>::push(&this->clause,&local_1c);
  }
  return;
}

Assistant:

void add(int lit)
    {
        reset();
        nomodel = true;
        if (lit)
            clause.push(import(lit));
        else
            addClause(clause), clause.clear();
    }